

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qanimationgroup.cpp
# Opt level: O3

bool __thiscall QAnimationGroup::event(QAnimationGroup *this,QEvent *event)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  QObject *this_00;
  QAnimationGroup *pQVar4;
  const_iterator cVar5;
  QChildEvent *childEvent;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (event->t == 0x47) {
    lVar2 = *(long *)(this + 8);
    cVar5 = std::
            __find_if<QList<QAbstractAnimation*>::const_iterator,__gnu_cxx::__ops::_Iter_equals_val<QObject*const>>
                      (*(long *)(lVar2 + 0xa8),*(long *)(lVar2 + 0xa8) + *(long *)(lVar2 + 0xb0) * 8
                      );
    if (cVar5.i != (QAbstractAnimation **)(*(long *)(lVar2 + 0xa8) + *(long *)(lVar2 + 0xb0) * 8)) {
      takeAnimation(this,(int)((ulong)((long)cVar5.i - *(long *)(lVar2 + 0xa8)) >> 3));
    }
  }
  else if (event->t == 0x44) {
    this_00 = QMetaObject::cast(&QAbstractAnimation::staticMetaObject,
                                (QObject *)event[1]._vptr_QEvent);
    if (this_00 != (QObject *)0x0) {
      pQVar4 = (QAnimationGroup *)QAbstractAnimation::group((QAbstractAnimation *)this_00);
      if (pQVar4 != this) {
        insertAnimation(this,*(int *)(*(long *)(this + 8) + 0xb0),(QAbstractAnimation *)this_00);
      }
    }
  }
  bVar3 = QAbstractAnimation::event((QAbstractAnimation *)this,event);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool QAnimationGroup::event(QEvent *event)
{
    Q_D(QAnimationGroup);
    if (event->type() == QEvent::ChildAdded) {
        QChildEvent *childEvent = static_cast<QChildEvent *>(event);
        if (QAbstractAnimation *a = qobject_cast<QAbstractAnimation *>(childEvent->child())) {
            if (a->group() != this)
                addAnimation(a);
        }
    } else if (event->type() == QEvent::ChildRemoved) {
        QChildEvent *childEvent = static_cast<QChildEvent *>(event);
        // You can only rely on the child being a QObject because in the QEvent::ChildRemoved
        // case it might be called from the destructor. Casting down to QAbstractAnimation then
        // entails undefined behavior, so compare items as QObjects (which std::find does internally):
        const QList<QAbstractAnimation *>::const_iterator it
            = std::find(d->animations.cbegin(), d->animations.cend(), childEvent->child());
        if (it != d->animations.cend())
            takeAnimation(it - d->animations.cbegin());
    }
    return QAbstractAnimation::event(event);
}